

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.h
# Opt level: O0

void __thiscall mario::EventLoop::assertInLoopThread(EventLoop *this)

{
  bool bVar1;
  EventLoop *this_local;
  
  bVar1 = isInLoopThread(this);
  if (!bVar1) {
    abortNotInLoopThread(this);
  }
  return;
}

Assistant:

void assertInLoopThread() {
		if (!isInLoopThread()) {
			abortNotInLoopThread();
		}
	}